

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_surface.hpp
# Opt level: O2

void __thiscall
sisl::utility::isosurface::march_function
          (isosurface *this,function *f,double *isoValue,double *stepSize,vector *origin,
          vector *extent,bool flip_normal,function *dx,function *dy,function *dz)

{
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *this_00;
  ply_mesh *this_01;
  double dVar1;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_02;
  double dVar2;
  uint uVar3;
  Scalar *pSVar4;
  long lVar5;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_03;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  ushort uVar9;
  ulong uVar10;
  int *piVar11;
  double dVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double dVar13;
  double dVar14;
  double local_298;
  double v100;
  vector x;
  pointer local_1d0;
  double v010;
  double v001;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_1b8;
  vector gv;
  double v110;
  double v000;
  double v111;
  double v101;
  double v011;
  int local_15c;
  int vertexIndexList [12];
  map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
  vMap;
  vector boundary;
  void *apvStack_40 [2];
  
  local_1b8 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)origin;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)extent,0);
  if (((0.0 < *pSVar4 || *pSVar4 == 0.0) &&
      (pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)extent,1),
      0.0 < *pSVar4 || *pSVar4 == 0.0)) &&
     (pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)extent,2),
     0.0 < *pSVar4 || *pSVar4 == 0.0)) {
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&vMap,local_1b8,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)extent);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&boundary,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&vMap);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)extent,0);
    dVar12 = floor(*pSVar4 / *stepSize);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)extent,1);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)extent,2);
    iVar7 = (int)dVar12;
    vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vMap._M_t._M_impl.super__Rb_tree_header._M_header;
    vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_15c = iVar7 * 2;
    this_00 = &this->faces;
    iVar8 = 0;
    vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    do {
      this_02 = local_1b8;
      if (iVar8 == iVar7) {
        processFaces(this,&vMap,this_00);
        (*f->_vptr_function[8])(0,apvStack_40,f,0,0);
        free(apvStack_40[0]);
        this_01 = &this->plyfile;
        uVar3 = 0;
        while( true ) {
          v100 = (double)CONCAT44(v100._4_4_,uVar3);
          if ((uint)this_01->m_currentIndex <= uVar3) break;
          ply_mesh::get_vertex_pos((ply_mesh *)&x,(uint *)this_01);
          vertexIndexList[0] = 3;
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&gv,vertexIndexList);
          if (dz == (function *)0x0 || (dy == (function *)0x0 || dx == (function *)0x0)) {
            (*f->_vptr_function[9])
                      ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vertexIndexList,
                       f,(ply_mesh *)&x);
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                      (&gv,(Matrix<double,__1,_1,_0,__1,_1> *)vertexIndexList);
            free((void *)CONCAT44(vertexIndexList[1],vertexIndexList[0]));
          }
          else {
            (*dx->_vptr_function[3])(dx,(ply_mesh *)&x);
            v000 = extraout_XMM0_Qa_07;
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
                      ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vertexIndexList,
                       &gv,&v000);
            (*dy->_vptr_function[3])(dy,(ply_mesh *)&x);
            v001 = extraout_XMM0_Qa_08;
            this_03 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                 vertexIndexList,&v001);
            (*dz->_vptr_function[3])(dz,(ply_mesh *)&x);
            v010 = extraout_XMM0_Qa_09;
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (this_03,&v010);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
                      ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vertexIndexList)
            ;
          }
          if (flip_normal) {
            v000 = (double)&gv;
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)vertexIndexList,
                       (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&v000);
            ply_mesh::set_normal(this_01,(uint *)&v100,(vector *)vertexIndexList);
            free((void *)CONCAT44(vertexIndexList[1],vertexIndexList[0]));
          }
          else {
            ply_mesh::set_normal(this_01,(uint *)&v100,&gv);
          }
          free(gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
          free((void *)CONCAT44(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data._4_4_,
                                (int)x.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data));
          uVar3 = v100._0_4_ + 1;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_sisl::vertex3>,_std::_Select1st<std::pair<const_int,_sisl::vertex3>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
        ::~_Rb_tree(&vMap._M_t);
        free(boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        return;
      }
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b8,0)
      ;
      dVar12 = *pSVar4;
      dVar13 = *stepSize;
      v000 = 0.0;
      v001 = 0.0;
      v010 = 0.0;
      v100 = 0.0;
      v011 = 0.0;
      v101 = 0.0;
      v111 = 0.0;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_02,1);
      local_298 = *pSVar4;
      dVar12 = (double)(float)((double)iVar8 * dVar13 + dVar12);
      iVar8 = iVar8 + 1;
      while( true ) {
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&boundary,
                            1);
        dVar13 = (double)(float)local_298;
        if (*pSVar4 <= dVar13) break;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b8,
                            2);
        (*f->_vptr_function[2])(dVar12,dVar13,*pSVar4,f);
        dVar14 = *stepSize;
        v000 = extraout_XMM0_Qa;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b8,
                            2);
        (*f->_vptr_function[2])(dVar14 + dVar12,dVar13,*pSVar4,f);
        dVar14 = *stepSize;
        v100 = extraout_XMM0_Qa_00;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b8,
                            2);
        (*f->_vptr_function[2])(dVar14 + dVar12,dVar14 + dVar13,*pSVar4,f);
        dVar14 = *stepSize;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b8,
                            2);
        (*f->_vptr_function[2])(dVar12,dVar14 + dVar13,*pSVar4,f);
        dVar2 = v000;
        dVar1 = v100;
        dVar14 = *isoValue;
        v010 = extraout_XMM0_Qa_02;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b8,
                            2);
        local_1d0 = (pointer)(ulong)((uint)(extraout_XMM0_Qa_02 < dVar14) << 7 |
                                     (uint)(dVar2 < dVar14) << 4 | (uint)(dVar1 < dVar14) << 5 |
                                    (uint)(extraout_XMM0_Qa_01 < dVar14) << 6);
        local_298 = *pSVar4;
        while( true ) {
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &boundary,2);
          dVar14 = (double)(float)local_298;
          if (*pSVar4 <= dVar14) break;
          (*f->_vptr_function[2])(dVar12,dVar13,*stepSize + dVar14,f);
          v001 = extraout_XMM0_Qa_03;
          (*f->_vptr_function[2])(*stepSize + dVar12,dVar13,*stepSize + dVar14,f);
          dVar1 = *stepSize;
          v101 = extraout_XMM0_Qa_04;
          (*f->_vptr_function[2])(dVar1 + dVar12,dVar1 + dVar13,dVar1 + dVar14,f);
          v111 = extraout_XMM0_Qa_05;
          (*f->_vptr_function[2])(dVar12,*stepSize + dVar13,*stepSize + dVar14,f);
          dVar1 = *isoValue;
          local_1d0 = (pointer)(ulong)((uint)(v101 < dVar1) << 5 |
                                       (uint)(v001 < dVar1) << 4 | (uint)((ulong)local_1d0 >> 4) |
                                       (uint)(v111 < dVar1) << 6 |
                                      (uint)(extraout_XMM0_Qa_06 < dVar1) << 7);
          v011 = extraout_XMM0_Qa_06;
          if (this->edges[(long)local_1d0] != 0) {
            uVar9 = 1;
            for (uVar10 = 0; uVar10 != 0xc; uVar10 = uVar10 + 1) {
              if ((uVar9 & this->edges[(long)local_1d0]) != 0) {
                (*(code *)((long)&DAT_0011d0c0 + (long)(int)(&DAT_0011d0c0)[uVar10 & 0xffffffff]))()
                ;
                return;
              }
              uVar9 = uVar9 * 2;
            }
            piVar11 = this->triangles[(long)local_1d0] + 2;
            while (lVar5 = (long)(*(int (*) [16])(piVar11 + -2))[0], lVar5 != -1) {
              if (flip_normal) {
                x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data.
                _0_4_ = vertexIndexList[lVar5];
                x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data.
                _4_4_ = vertexIndexList[piVar11[-1]];
                x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _0_4_ = vertexIndexList[*piVar11];
                std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>::
                emplace_back<std::tuple<int,int,int>>
                          ((vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>
                            *)this_00,(tuple<int,_int,_int> *)&x);
              }
              else {
                x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data.
                _0_4_ = vertexIndexList[*piVar11];
                x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data.
                _4_4_ = vertexIndexList[piVar11[-1]];
                x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _0_4_ = vertexIndexList[lVar5];
                std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>::
                emplace_back<std::tuple<int,int,int>>
                          ((vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>
                            *)this_00,(tuple<int,_int,_int> *)&x);
              }
              piVar11 = piVar11 + 3;
            }
          }
          local_298 = dVar14 + *stepSize;
          v100 = v101;
          v010 = v011;
          v000 = v001;
        }
        local_298 = *stepSize + dVar13;
      }
    } while( true );
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Invalid extent for marching cubes!";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void march_function(
            function *f,
            const double &isoValue,
            const double &stepSize,
            sisl::vector origin,
            sisl::vector extent,
            bool flip_normal = false,
            sisl::function *dx = nullptr,
            sisl::function *dy = nullptr,
            sisl::function *dz = nullptr){

        // Namespaces
        using namespace std;
        using namespace sisl;

        if(extent[0] < 0 || extent[1] < 0 || extent[2] < 0) throw "Invalid extent for marching cubes!";

        sisl::vector boundary = origin + extent;
        // Figure out the steps in each direction
        int xres = (int)floor((extent[0])/stepSize);
        int yres = (int)floor((extent[1])/stepSize);
        int zres = (int)floor((extent[2])/stepSize);
        int res = xres*2;

        map<int, sisl::vertex3 > vMap;

        #pragma omp parallel for
        for(int i = 0; i < xres; i++) {
            float x = origin[0] + i * stepSize;
            int j = 0;

            double     v000 = 0, v001 = 0, v010 = 0, v100 = 0,
                    v011 = 0, v110 = 0, v101 = 0, v111 = 0;
            // Break up the inner loops over
            for(float y = origin[1]; y < boundary[1]; y+=stepSize,j++) {
                int idx = 0;
                int k = 0;

                // Eval these only once
                v000 = (*f)(x,                y,            origin[2]);
                v100 = (*f)(x+stepSize,     y,             origin[2]);
                v110 = (*f)(x+stepSize,     y+stepSize,    origin[2]);
                v010 = (*f)(x,                y+stepSize,    origin[2]);

                idx |=    (v000 < isoValue) ? 16 : 0;     // {0,0,0}, 0001000
                idx |=    (v100 < isoValue) ? 32 : 0;     // {1,0,0}, 0010000
                idx |=    (v110 < isoValue) ? 64 : 0;     // {1,1,0}, 0100000
                idx |=    (v010 < isoValue) ? 128 : 0;     // {0,1,0}, 1000000

                for(float z = origin[2]; z < boundary[2]; z+=stepSize, k++) {
                    v001 = (*f)(x,                y,             z+stepSize);
                    v101 = (*f)(x+stepSize,        y,             z+stepSize);
                    v111 = (*f)(x+stepSize,        y+stepSize,    z+stepSize);
                    v011 = (*f)(x,                y+stepSize,    z+stepSize);

                    idx >>= 4;
                    idx |= (v001 < isoValue) ? 16 : 0 ;  // {0,0,1}
                    idx |= (v101 < isoValue) ? 32 : 0 ;  // {1,0,1}
                    idx |= (v111 < isoValue) ? 64 : 0 ;  // {1,1,1}
                    idx |= (v011 < isoValue) ? 128 : 0 ; // {0,1,1}

                    // Cube is entirely in/out of the surface
                    if (!edges[idx]){
                        v000 = v001;
                        v100 = v101;
                        v110 = v111;
                        v010 = v011;
                        continue;
                    }

                    // Find the vertices where the surface intersects the cube
                    int edgeBit = 1;
                    int vertexIndexList[12];

                    #define MAP_INDEX(x,y,z) (( (((x+i)*res) + (y+j))*res)+(z+k)-1)
                    #define ss stepSize
                    for(int c = 0; c < 12; c++) {
                        if(edges[idx] & edgeBit){
                            switch(c){
                                case 0:
                                    vertexIndexList[c] = MAP_INDEX(0,0,0) * 3;//vIndex*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z,1,1,1),
                                        vertex3(x+ss,y,z,1,1,1),
                                        v000,v100,isoValue,ss,f);
                                    break;

                                case 2:
                                    vertexIndexList[c] = MAP_INDEX(0,1,0) * 3; //(vIndex+zres)*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y+ss,z,1,1,1),
                                        vertex3(x+ss,y+ss,z,1,1,1),
                                        v010,v110,isoValue,ss,f);
                                    break;
                                case 4:
                                    vertexIndexList[c] = MAP_INDEX(0,0,1) * 3; //(vIndex+1)*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z+ss,1,1,1),
                                        vertex3(x,y,z+ss,1,1,1),
                                        v101,v001,isoValue,ss,f);
                                    break;
                                case 6:
                                    vertexIndexList[c] = MAP_INDEX(0,1,1) * 3; //(vIndex+yres+1)*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y+ss,z+ss,1,1,1),
                                        vertex3(x,y+ss,z+ss,1,1,1),
                                        v111,v011,isoValue,ss,f);
                                    break;
                                /////////////

                                case 1:
                                    vertexIndexList[c] = MAP_INDEX(1,0,0) * 3 + 1;//(vIndex+yres*zres)*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z,1,1,1),
                                        vertex3(x+ss,y+ss,z,1,1,1),
                                        v100,v110,isoValue,ss,f);
                                    break;

                                case 3:
                                    vertexIndexList[c] = MAP_INDEX(0,0,0) * 3 + 1;//vIndex*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z,1,1,1),
                                        vertex3(x,y+ss,z,1,1,1),
                                        v000,v010,isoValue,ss,f);
                                    break; // 0, 0, 0

                                case 5:
                                    vertexIndexList[c] = MAP_INDEX(1,0,1) * 3 + 1;//(vIndex+yres*zres+1)*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z+ss,1,1,1),
                                        vertex3(x+ss,y+ss,z+ss,1,1,1),
                                        v101,v111,isoValue,ss,f);
                                    break; // 1, 0, 1
                                case 7:
                                    vertexIndexList[c] = MAP_INDEX(0,0,1) * 3 + 1;//(vIndex+1)*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z+ss,1,1,1),
                                        vertex3(x,y+ss,z+ss,1,1,1),
                                        v001,v011,isoValue,ss,f);
                                    break; //0,0,1

                                //////////////////////////////

                                case 8:
                                    vertexIndexList[c] = MAP_INDEX(0,0,0) * 3 + 2;//vIndex*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z,1,1,1),
                                        vertex3(x,y,z+ss,1,1,1),
                                        v000,v001,isoValue,ss,f);
                                    break; //0,0,0
                                case 9:
                                    vertexIndexList[c] = MAP_INDEX(1,0,0) * 3 + 2;//(vIndex+yres*zres)*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z,1,1,1),
                                        vertex3(x+ss,y,z+ss,1,1,1),
                                        v100,v101,isoValue,ss,f);
                                    break; //1,0,0
                                case 10:
                                    vertexIndexList[c] = MAP_INDEX(1,1,0) * 3 + 2;//(vIndex+yres*zres+zres)*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y+ss,z,1,1,1),
                                        vertex3(x+ss,y+ss,z+ss,1,1,1),
                                        v110,v111,isoValue,ss,f);
                                    break; //1,1,0
                                case 11:
                                    vertexIndexList[c] = MAP_INDEX(0,1,0) * 3 + 2;//(vIndex+yres)*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y+ss,z,1,1,1),
                                        vertex3(x,y+ss,z+ss,1,1,1),
                                        v010,v011,isoValue,ss,f);
                                    break; //0,1,0
                            }
                        }
                        edgeBit<<=1;
                    }

                    #undef ss
                    #undef MAP_INDEX

                    // Create the triangles
                    for(int c = 0; triangles[idx][c] != -1;){

                        #pragma omp critical (add_face2)
                        {
                            if(flip_normal) {
                                faces.push_back(tuple<int,int,int>(
                                    vertexIndexList[triangles[idx][c+2]],
                                    vertexIndexList[triangles[idx][c+1]],
                                    vertexIndexList[triangles[idx][c]]));

                            }else {
                                faces.push_back(tuple<int,int,int>(
                                    vertexIndexList[triangles[idx][c]],
                                    vertexIndexList[triangles[idx][c+1]],
                                    vertexIndexList[triangles[idx][c+2]]));
                            }
                            c += 3;
                        }
                    }

                    // Setup for next cube
                    v000 = v001;
                    v100 = v101;
                    v110 = v111;
                    v010 = v011;
                }
            }
        }
        processFaces(&vMap, faces);

        // Now that we know where all the vertices should lie, 
        // let's figure out the normal directions
        bool use_grad = false;
        try {
            f->grad(0,0,0);
            use_grad = true;
        } catch(const char *e) { }
        bool use_d_func = !(dx == nullptr || dy == nullptr || dz == nullptr); 

        for(unsigned int i = 0; i < plyfile.count_vertices(); i++) {
            vector x = plyfile.get_vertex_pos(i);
            vector gv(3);

            if(use_d_func) {
                gv << (*dx)(x), (*dy)(x), (*dz)(x);
            }else if(use_grad) {
                gv = f->grad(x);
            }else {
                double h = m_shadingSs;
                double ddx = ((*f)(x[0]+h, x[1]  , x[2]  ) - (*f)(x[0]-h, x[1]  , x[2]  ))/(2*h);
                double ddy = ((*f)(x[0],   x[1]+h, x[2]  ) - (*f)(x[0]  , x[1]-h, x[2]  ))/(2*h);
                double ddz = ((*f)(x[0],   x[1]  , x[2]+h) - (*f)(x[0]  , x[1]  , x[2]-h))/(2*h);
                gv << ddx, ddy, ddz;
            }
            if(flip_normal)
                plyfile.set_normal(i, -gv);
            else
                plyfile.set_normal(i, gv);
        }

    }